

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O3

double __thiscall
anon_unknown.dwarf_1f808::sampleX<float>
          (anon_unknown_dwarf_1f808 *this,TypedImageChannel<float> *channel,int w,double x,int y,
          Extrapolation ext)

{
  uint x_00;
  float fVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  float *pfVar6;
  ulong uVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  
  if (0.0 <= x) {
    uVar8 = (uint)x;
  }
  else {
    dVar9 = -x;
    uVar8 = -((uint)((double)(int)dVar9 < dVar9) + (int)dVar9);
  }
  x_00 = uVar8 + 1;
  uVar7 = (ulong)x_00;
  switch(ext) {
  case BLACK:
    dVar10 = 0.0;
    dVar9 = 0.0;
    if ((int)uVar8 < w && -1 < (int)uVar8) {
      dVar9 = (double)*(float *)((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
                                (ulong)uVar8 * 4 + (long)y * (long)this * 4);
    }
    if (w <= (int)x_00 || (int)uVar8 < -1) goto LAB_00109836;
    lVar5 = (long)&(channel->super_ImageChannel)._vptr_ImageChannel + (long)y * (long)this * 4;
    break;
  case CLAMP:
    uVar3 = w - 1;
    uVar4 = uVar3;
    if ((int)uVar8 < (int)uVar3) {
      uVar4 = uVar8;
    }
    if ((int)uVar8 < 0) {
      uVar4 = 0;
    }
    if ((int)x_00 < (int)uVar3) {
      uVar3 = x_00;
    }
    if ((int)uVar8 < -1) {
      uVar3 = 0;
    }
    lVar5 = (long)&(channel->super_ImageChannel)._vptr_ImageChannel + (long)y * (long)this * 4;
    fVar1 = *(float *)(lVar5 + (long)(int)uVar4 * 4);
    goto LAB_001097aa;
  case PERIODIC:
    if ((int)uVar8 < 0) {
      if (-1 < w) {
        uVar3 = ((~uVar8 + w) - (~uVar8 + w) % (uint)w) + uVar8;
        if (uVar8 != 0xffffffff) {
          uVar8 = ((w - uVar8) - 2) / (uint)w;
          goto LAB_00109808;
        }
        goto LAB_0010972c;
      }
      uVar3 = uVar8 - ((~w - uVar8) / (uint)-w) * w;
      if (uVar8 == 0xffffffff) goto LAB_00109801;
      uVar8 = (~w - x_00) / (uint)-w;
    }
    else if (w < 0) {
      uVar3 = uVar8 + (uVar8 / (uint)-w) * w;
LAB_00109801:
      uVar8 = x_00 / (uint)-w;
LAB_00109808:
      uVar8 = -uVar8;
    }
    else {
      uVar3 = uVar8 % (uint)w;
LAB_0010972c:
      uVar8 = x_00 / (uint)w;
    }
    lVar5 = (long)&(channel->super_ImageChannel)._vptr_ImageChannel + (long)y * (long)this * 4;
    dVar9 = (double)*(float *)(lVar5 + (long)(int)uVar3 * 4);
    uVar7 = (ulong)(int)(x_00 - uVar8 * w);
    break;
  case MIRROR:
    iVar2 = mirror(uVar8,w);
    uVar3 = mirror(x_00,w);
    lVar5 = (long)&(channel->super_ImageChannel)._vptr_ImageChannel + (long)y * (long)this * 4;
    fVar1 = *(float *)(lVar5 + (long)iVar2 * 4);
LAB_001097aa:
    dVar9 = (double)fVar1;
    pfVar6 = (float *)(lVar5 + (long)(int)uVar3 * 4);
    goto LAB_0010982f;
  default:
    dVar9 = 0.0;
    dVar10 = 0.0;
    goto LAB_00109836;
  }
  pfVar6 = (float *)(lVar5 + uVar7 * 4);
LAB_0010982f:
  dVar10 = (double)*pfVar6;
LAB_00109836:
  return ((double)(int)x_00 - x) * dVar9 + (1.0 - ((double)(int)x_00 - x)) * dVar10;
}

Assistant:

double
sampleX (
    const TypedImageChannel<T>& channel,
    int                         w,
    double                      x,
    int                         y,
    Extrapolation               ext)
{
    //
    // Sample an image channel at location (x, y), where
    // x is a floating point number, and y is an integer.
    //

    int    xs = IMATH_NAMESPACE::floor (x);
    int    xt = xs + 1;
    double s  = xt - x;
    double t  = 1 - s;
    double vs = 0.0;
    double vt = 0.0;

    switch (ext)
    {
        case BLACK:

            vs = (xs >= 0 && xs < w) ? double (channel (xs, y)) : 0.0;
            vt = (xt >= 0 && xt < w) ? double (channel (xt, y)) : 0.0;
            break;

        case CLAMP:

            xs = IMATH_NAMESPACE::clamp (xs, 0, w - 1);
            xt = IMATH_NAMESPACE::clamp (xt, 0, w - 1);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;

        case PERIODIC:

            xs = modp (xs, w);
            xt = modp (xt, w);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;

        case MIRROR:

            xs = mirror (xs, w);
            xt = mirror (xt, w);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;
    }

    return s * vs + t * vt;
}